

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUtilitySourceCommand.cxx
# Opt level: O1

bool __thiscall
cmUtilitySourceCommand::InitialPass
          (cmUtilitySourceCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  cmCacheManager *pcVar4;
  cmUtilitySourceCommand *pcVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  cmake *pcVar10;
  long *plVar11;
  long *plVar12;
  size_type *psVar13;
  pointer pbVar14;
  string utilityName;
  string utilityDirectory;
  string utilityExecutable;
  string cmakeCFGout;
  string cacheEntry;
  string exePath;
  string utilitySource;
  string relativeSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string local_1d8;
  string local_1b8;
  string local_198;
  cmUtilitySourceCommand *local_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  string local_150;
  undefined1 *local_130;
  char *local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  long *local_110;
  long local_108;
  long local_100 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  bVar6 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0034,
                     "The utility_source command should not be called; see CMP0034.");
  if (bVar6) {
    return true;
  }
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) < 0x41) {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  pcVar2 = (pbVar14->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar2,pcVar2 + pbVar14->_M_string_length);
  pcVar8 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,&local_150);
  pcVar3 = (this->super_cmCommand).Makefile;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"CMAKE_CFG_INTDIR","");
  pcVar9 = cmMakefile::GetRequiredDefinition(pcVar3,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCommand).Makefile;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_178 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"CMAKE_CROSSCOMPILING","");
  bVar6 = cmMakefile::IsOn(pcVar3,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    bVar6 = pcVar8 != (char *)0x0;
    if (bVar6) {
LAB_002cea70:
      if (bVar6) goto LAB_002cf252;
    }
    else {
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d8,"UTILITY_SOURCE is used in cross compiling mode for ","");
      std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_150._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_1d8);
      cmSystemTools::Message(local_1d8._M_dataplus._M_p,"Warning");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    pcVar10 = cmMakefile::GetCMakeInstance((local_178->super_cmCommand).Makefile);
    if (pcVar8 != (char *)0x0) {
      pcVar4 = pcVar10->CacheManager;
      pcVar8 = strstr(pcVar8,"(IntDir)");
      if (((pcVar8 == (char *)0x0) ||
          ((pcVar9 != (char *)0x0 && (iVar7 = strcmp(pcVar9,"$(IntDir)"), iVar7 == 0)))) &&
         (pcVar4->CacheMajorVersion != 0)) {
        bVar6 = pcVar4->CacheMinorVersion != 0;
        goto LAB_002cea70;
      }
    }
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  pcVar2 = pbVar14[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,pcVar2,pcVar2 + pbVar14[1]._M_string_length);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar2 = pbVar14[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar2,pcVar2 + pbVar14[2]._M_string_length);
  pcVar8 = cmMakefile::GetCurrentSourceDirectory((local_178->super_cmCommand).Makefile);
  std::__cxx11::string::string((string *)&local_110,pcVar8,(allocator *)&local_170);
  paVar1 = &local_1b8.field_2;
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_110,(long)local_110 + local_108);
  std::__cxx11::string::append((char *)&local_1b8);
  plVar11 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_1b8,(ulong)local_f0._M_dataplus._M_p);
  plVar12 = plVar11 + 2;
  if ((long *)*plVar11 == plVar12) {
    local_160 = *plVar12;
    lStack_158 = plVar11[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *plVar12;
    local_170 = (long *)*plVar11;
  }
  local_168 = plVar11[1];
  *plVar11 = (long)plVar12;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_110,(string *)&local_170);
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  bVar6 = cmsys::SystemTools::FileExists((char *)local_110);
  if (bVar6) {
    pbVar14 = pbVar14 + 3;
    do {
      if (pbVar14 ==
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar3 = (local_178->super_cmCommand).Makefile;
        local_1b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"CMAKE_CFG_INTDIR","");
        pcVar8 = cmMakefile::GetRequiredDefinition(pcVar3,&local_1b8);
        std::__cxx11::string::string((string *)&local_170,pcVar8,(allocator *)&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = local_178;
        pcVar8 = cmMakefile::GetCurrentBinaryDirectory((local_178->super_cmCommand).Makefile);
        std::__cxx11::string::string((string *)&local_1b8,pcVar8,(allocator *)&local_130);
        local_130 = &local_120;
        local_128 = (char *)0x0;
        local_120 = 0;
        pcVar3 = (pcVar5->super_cmCommand).Makefile;
        paVar1 = &local_198.field_2;
        local_198._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_198,"EXECUTABLE_OUTPUT_PATH","");
        pcVar8 = cmMakefile::GetDefinition(pcVar3,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar1) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if (pcVar8 != (char *)0x0) {
          pcVar3 = (pcVar5->super_cmCommand).Makefile;
          local_198._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_198,"EXECUTABLE_OUTPUT_PATH","");
          pcVar9 = cmMakefile::GetDefinition(pcVar3,&local_198);
          pcVar8 = local_128;
          strlen(pcVar9);
          std::__cxx11::string::_M_replace((ulong)&local_130,0,pcVar8,(ulong)pcVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != paVar1) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_128 == (char *)0x0) {
          std::operator+(&local_198,"/",&local_f0);
          std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_198._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != paVar1) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_1b8);
        }
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,local_1b8._M_dataplus._M_p,
                   local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
        std::__cxx11::string::append((char *)local_d0);
        plVar11 = (long *)std::__cxx11::string::_M_append((char *)local_d0,(ulong)local_170);
        plVar12 = plVar11 + 2;
        if ((long *)*plVar11 == plVar12) {
          local_80 = *plVar12;
          lStack_78 = plVar11[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar12;
          local_90 = (long *)*plVar11;
        }
        local_88 = plVar11[1];
        *plVar11 = (long)plVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_90);
        plVar12 = plVar11 + 2;
        if ((long *)*plVar11 == plVar12) {
          local_60 = *plVar12;
          lStack_58 = plVar11[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar12;
          local_70 = (long *)*plVar11;
        }
        local_68 = plVar11[1];
        *plVar11 = (long)plVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_70,(ulong)local_1d8._M_dataplus._M_p);
        plVar12 = plVar11 + 2;
        if ((long *)*plVar11 == plVar12) {
          local_a0 = *plVar12;
          uStack_98 = (undefined4)plVar11[3];
          uStack_94 = *(undefined4 *)((long)plVar11 + 0x1c);
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar12;
          local_b0 = (long *)*plVar11;
        }
        local_a8 = plVar11[1];
        *plVar11 = (long)plVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        pcVar3 = (local_178->super_cmCommand).Makefile;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"CMAKE_EXECUTABLE_SUFFIX","");
        cmMakefile::GetDefinition(pcVar3,&local_50);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_198.field_2._M_allocated_capacity = *psVar13;
          local_198.field_2._8_8_ = plVar11[3];
        }
        else {
          local_198.field_2._M_allocated_capacity = *psVar13;
          local_198._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_198._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        pcVar5 = local_178;
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0],local_c0[0] + 1);
        }
        cmsys::SystemTools::ReplaceString(&local_198,"/./","/");
        cmMakefile::AddCacheDefinition
                  ((pcVar5->super_cmCommand).Makefile,&local_150,local_198._M_dataplus._M_p,
                   "Path to an internal program.",FILEPATH,false);
        cmsys::SystemTools::ConvertToUnixSlashes(&local_198);
        cmMakefile::AddCacheDefinition
                  ((pcVar5->super_cmCommand).Makefile,&local_198,local_1d8._M_dataplus._M_p,
                   "Executable to project name.",INTERNAL,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if (local_170 != &local_160) {
          operator_delete(local_170,local_160 + 1);
        }
        break;
      }
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,local_110,(long)local_110 + local_108);
      std::__cxx11::string::append((char *)&local_1b8);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_1b8,(ulong)(pbVar14->_M_dataplus)._M_p);
      local_170 = &local_160;
      plVar12 = plVar11 + 2;
      if ((long *)*plVar11 == plVar12) {
        local_160 = *plVar12;
        lStack_158 = plVar11[3];
      }
      else {
        local_160 = *plVar12;
        local_170 = (long *)*plVar11;
      }
      local_168 = plVar11[1];
      *plVar11 = (long)plVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      bVar6 = cmsys::SystemTools::FileExists((char *)local_170);
      if (local_170 != &local_160) {
        operator_delete(local_170,local_160 + 1);
      }
      pbVar14 = pbVar14 + 1;
    } while (bVar6);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
LAB_002cf252:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmUtilitySourceCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0034,
      "The utility_source command should not be called; see CMP0034."))
    { return true; }
  if(args.size() < 3)
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::vector<std::string>::const_iterator arg = args.begin();

  // The first argument is the cache entry name.
  std::string cacheEntry = *arg++;
  const char* cacheValue =
    this->Makefile->GetDefinition(cacheEntry);
  // If it exists already and appears up to date then we are done.  If
  // the string contains "(IntDir)" but that is not the
  // CMAKE_CFG_INTDIR setting then the value is out of date.
  const char* intDir =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");

  bool haveCacheValue = false;
  if (this->Makefile->IsOn("CMAKE_CROSSCOMPILING"))
    {
    haveCacheValue = (cacheValue != 0);
    if (!haveCacheValue)
      {
      std::string msg = "UTILITY_SOURCE is used in cross compiling mode for ";
      msg += cacheEntry;
      msg += ". If your intention is to run this executable, you need to "
            "preload the cache with the full path to a version of that "
            "program, which runs on this build machine.";
      cmSystemTools::Message(msg.c_str() ,"Warning");
      }
    }
  else
    {
    cmCacheManager *manager =
        this->Makefile->GetCMakeInstance()->GetCacheManager();
    haveCacheValue = (cacheValue &&
     (strstr(cacheValue, "(IntDir)") == 0 ||
      (intDir && strcmp(intDir, "$(IntDir)") == 0)) &&
     (manager->GetCacheMajorVersion() != 0 &&
      manager->GetCacheMinorVersion() != 0 ));
    }

  if(haveCacheValue)
    {
    return true;
    }

  // The second argument is the utility's executable name, which will be
  // needed later.
  std::string utilityName = *arg++;

  // The third argument specifies the relative directory of the source
  // of the utility.
  std::string relativeSource = *arg++;
  std::string utilitySource = this->Makefile->GetCurrentSourceDirectory();
  utilitySource = utilitySource+"/"+relativeSource;

  // If the directory doesn't exist, the source has not been included.
  if(!cmSystemTools::FileExists(utilitySource.c_str()))
    { return true; }

  // Make sure all the files exist in the source directory.
  while(arg != args.end())
    {
    std::string file = utilitySource+"/"+*arg++;
    if(!cmSystemTools::FileExists(file.c_str()))
      { return true; }
    }

  // The source exists.
  std::string cmakeCFGout =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");
  std::string utilityDirectory = this->Makefile->GetCurrentBinaryDirectory();
  std::string exePath;
  if (this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH"))
    {
    exePath = this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH");
    }
  if(!exePath.empty())
    {
    utilityDirectory = exePath;
    }
  else
    {
    utilityDirectory += "/"+relativeSource;
    }

  // Construct the cache entry for the executable's location.
  std::string utilityExecutable =
    utilityDirectory+"/"+cmakeCFGout+"/"
    +utilityName+this->Makefile->GetDefinition("CMAKE_EXECUTABLE_SUFFIX");

  // make sure we remove any /./ in the name
  cmSystemTools::ReplaceString(utilityExecutable, "/./", "/");

  // Enter the value into the cache.
  this->Makefile->AddCacheDefinition(cacheEntry,
                                 utilityExecutable.c_str(),
                                 "Path to an internal program.",
                                 cmState::FILEPATH);
  // add a value into the cache that maps from the
  // full path to the name of the project
  cmSystemTools::ConvertToUnixSlashes(utilityExecutable);
  this->Makefile->AddCacheDefinition(utilityExecutable,
                                 utilityName.c_str(),
                                 "Executable to project name.",
                                 cmState::INTERNAL);

  return true;
}